

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O0

int __thiscall crnlib::pixel_packer::init(pixel_packer *this,EVP_PKEY_CTX *ctx)

{
  pixel_packer *extraout_RAX;
  uint in_ECX;
  uint in_EDX;
  uint uVar1;
  byte in_R8B;
  uint i_1;
  uint i;
  uint local_34;
  uint local_28;
  uint local_24;
  undefined1 local_1;
  
  uVar1 = (uint)ctx;
  clear((pixel_packer *)0x1315ad);
  if ((((uVar1 == 0) || (4 < uVar1)) || (in_EDX == 0)) || (0x20 < in_EDX)) {
    local_1 = 0;
    this = extraout_RAX;
  }
  else {
    for (local_24 = 0; local_24 < uVar1; local_24 = local_24 + 1) {
      this->m_comp_size[local_24] = in_EDX;
      this->m_comp_ofs[local_24] = local_24 * in_EDX;
      if ((in_R8B & 1) != 0) {
        this->m_comp_ofs[local_24] = (uVar1 - 1) * in_EDX - this->m_comp_ofs[local_24];
      }
    }
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      this->m_comp_max[local_28] = (int)(1L << ((byte)this->m_comp_size[local_28] & 0x3f)) - 1;
    }
    local_34 = in_ECX;
    if ((int)in_ECX < 0) {
      local_34 = uVar1 * in_EDX + 7 >> 3;
    }
    this->m_pixel_stride = local_34;
    local_1 = 1;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool init(uint num_comps, uint bits_per_comp, int pixel_stride = -1, bool reversed = false) {
    clear();

    if ((num_comps < 1) || (num_comps > 4) || (bits_per_comp < 1) || (bits_per_comp > 32)) {
      CRNLIB_ASSERT(0);
      return false;
    }

    for (uint i = 0; i < num_comps; i++) {
      m_comp_size[i] = bits_per_comp;
      m_comp_ofs[i] = i * bits_per_comp;
      if (reversed)
        m_comp_ofs[i] = ((num_comps - 1) * bits_per_comp) - m_comp_ofs[i];
    }

    for (uint i = 0; i < 4; i++)
      m_comp_max[i] = static_cast<uint32>((1ULL << m_comp_size[i]) - 1ULL);

    m_pixel_stride = (pixel_stride >= 0) ? pixel_stride : (num_comps * bits_per_comp + 7) / 8;

    return true;
  }